

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O2

char * Diligent::Parsing::SkipDelimitersAndComments<char_const*>
                 (char **Start,char **End,char *Delimiters,SKIP_COMMENT_FLAGS CommentFlags)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  char *Pos;
  char *local_30;
  
  pcVar2 = *Start;
  while( true ) {
    if (pcVar2 == *End) {
      return pcVar2;
    }
    if (*pcVar2 == '\0') break;
    local_30 = pcVar2;
    local_30 = SkipDelimiters<char_const*>(&local_30,End,Delimiters);
    pcVar1 = SkipComment<char_const*>(&local_30,End,CommentFlags);
    bVar3 = pcVar1 == pcVar2;
    pcVar2 = pcVar1;
    if (bVar3) {
      return pcVar1;
    }
  }
  return pcVar2;
}

Assistant:

IteratorType SkipDelimitersAndComments(const IteratorType& Start,
                                       const IteratorType& End,
                                       const char*         Delimiters   = nullptr,
                                       SKIP_COMMENT_FLAGS  CommentFlags = SKIP_COMMENT_FLAG_ALL) noexcept(false)
{
    auto Pos = Start;
    while (Pos != End && *Pos != '\0')
    {
        const auto BlockStart = Pos;

        Pos = SkipDelimiters(Pos, End, Delimiters);
        Pos = SkipComment(Pos, End, CommentFlags); // May throw
        if (Pos == BlockStart)
            break;
    };

    return Pos;
}